

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_wav_uninit(ma_wav *pWav,ma_allocation_callbacks *pAllocationCallbacks)

{
  if (pWav != (ma_wav *)0x0) {
    ma_dr_wav_uninit(&pWav->dr);
    return;
  }
  return;
}

Assistant:

MA_API void ma_wav_uninit(ma_wav* pWav, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL) {
        return;
    }

    (void)pAllocationCallbacks;

    #if !defined(MA_NO_WAV)
    {
        ma_dr_wav_uninit(&pWav->dr);
    }
    #else
    {
        /* wav is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
    }
    #endif

    ma_data_source_uninit(&pWav->ds);
}